

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_angle_delta(aom_reader *r,aom_cdf_prob *cdf)

{
  int iVar1;
  aom_reader *in_RSI;
  int sym;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar1 = aom_read_symbol_(in_RSI,(aom_cdf_prob *)
                                  CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
  return iVar1 + -3;
}

Assistant:

static int read_angle_delta(aom_reader *r, aom_cdf_prob *cdf) {
  const int sym = aom_read_symbol(r, cdf, 2 * MAX_ANGLE_DELTA + 1, ACCT_STR);
  return sym - MAX_ANGLE_DELTA;
}